

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O1

int * generateProperInputVector(Abc_Ntk_t *pNtk,coloring *c,Vec_Int_t *randomVector)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int *__ptr;
  long lVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  
  iVar11 = pNtk->vPos->nSize;
  iVar6 = pNtk->vPis->nSize;
  __ptr = (int *)malloc((long)iVar6 * 4);
  if (0 < (long)iVar6) {
    lVar5 = (long)iVar11;
    iVar6 = iVar11 + iVar6;
    uVar1 = randomVector->nSize;
    uVar7 = 0;
    uVar8 = 0;
    if (0 < (int)uVar1) {
      uVar8 = (ulong)uVar1;
    }
    do {
      if (uVar7 == uVar1) {
        if (__ptr != (int *)0x0) {
          free(__ptr);
        }
        return (int *)0x0;
      }
      if (uVar7 == uVar8) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = c->clen[iVar11];
      if (-1 < iVar2) {
        iVar9 = iVar2 + iVar11;
        if (iVar2 + iVar11 < iVar11) {
          iVar9 = iVar11;
        }
        piVar4 = c->lab;
        iVar3 = randomVector->pArray[uVar7];
        lVar10 = 0;
        do {
          __ptr[piVar4[iVar11 + lVar10] - lVar5] = iVar3;
          lVar10 = lVar10 + 1;
        } while ((iVar9 - iVar11) + 1 != (int)lVar10);
      }
      iVar11 = iVar11 + iVar2 + 1;
      uVar7 = uVar7 + 1;
    } while (iVar11 < iVar6);
  }
  return __ptr;
}

Assistant:

static int * 
generateProperInputVector( Abc_Ntk_t * pNtk, struct coloring *c, Vec_Int_t * randomVector )
{
    int * vPiValues;    
    int i, j, k, bit, input;
    int numouts =  Abc_NtkPoNum(pNtk);
    int numins =  Abc_NtkPiNum(pNtk);
    int n = numouts + numins;

    vPiValues = ABC_ALLOC( int,  numins);   

    for (i = numouts, k = 0; i < n; i += (c->clen[i]+1), k++) {
        if (k == Vec_IntSize(randomVector)) break;

        bit = Vec_IntEntry(randomVector, k);
        for (j = i; j <= (i + c->clen[i]); j++) {
            input = c->lab[j] - numouts;
            vPiValues[input] = bit;
        }
    }

    //if (k != Vec_IntSize(randomVector)) {
    if (i < n) {
        ABC_FREE( vPiValues );
        return NULL;
    }

    return vPiValues;
}